

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

void __thiscall
CVmObjBigNum::calc_cos_series
          (CVmObjBigNum *this,char *new_ext,char *ext1,char *ext2,char *ext3,char *ext4,char *ext5,
          char *ext6,char *ext7)

{
  bool bVar1;
  char *src;
  char *ext1_00;
  long lVar2;
  char *local_48;
  
  local_48 = ext6;
  copy_val(ext3,(char *)"\x01",0);
  ext3[5] = ext3[5] & 0xfU | 0x20;
  compute_prod_into(ext7,ext1,ext1);
  copy_val(ext1,ext7,0);
  copy_val(ext5,(char *)"\x01",0);
  bVar1 = true;
  lVar2 = 3;
  while( true ) {
    ext1_00 = ext1;
    src = ext5;
    compute_quotient_into(ext4,(char *)0x0,ext1_00,ext3);
    if (((ext4[4] & 8U) != 0) ||
       ((int)(uint)*(ushort *)ext4 < (int)*(short *)(src + 2) - (int)*(short *)(ext4 + 2))) break;
    if (bVar1) {
      ext4[4] = ext4[4] ^ 1;
    }
    compute_sum_into(local_48,src,ext4);
    compute_prod_into(ext2,ext1_00,ext7);
    mul_by_long(ext3,(lVar2 + 1) * lVar2);
    bVar1 = (bool)(bVar1 ^ 1);
    lVar2 = lVar2 + 2;
    ext5 = local_48;
    ext1 = ext2;
    ext2 = ext1_00;
    local_48 = src;
  }
  copy_val(new_ext,src,1);
  return;
}

Assistant:

void CVmObjBigNum::calc_cos_series(VMG_ char *new_ext, char *ext1,
                                   char *ext2, char *ext3, char *ext4,
                                   char *ext5, char *ext6, char *ext7)
{
    ulong n;
    int neg_term;
    char *tmp;

    /* start with 2! (i.e., 2) in r3 */
    copy_val(ext3, get_one(), FALSE);
    set_dig(ext3, 0, 2);

    /* 
     *   calculate x^2 into r7 - we need x^2, x^4, x^6, etc, so we can
     *   just multiply the last value by x^2 to get the next power we need
     */
    compute_prod_into(ext7, ext1, ext1);

    /* 
     *   the first power we need is x^2, so copy it into r1 (our current
     *   power of x register) 
     */
    copy_val(ext1, ext7, FALSE);

    /* 
     *   start with 1 in r5, the accumulator (the first term of the series
     *   is the constant value 1) 
     */
    copy_val(ext5, get_one(), FALSE);

    /* 
     *   start at term n=2 in our expansion (the first term is just the
     *   constant value 1, so we can start at the second term) 
     */
    n = 2;

    /* 
     *   the first term we calculate (i.e., the second term in the actual
     *   series) is negative 
     */
    neg_term = TRUE;

    /* go until we have a precise enough value */
    for (;;)
    {
        /* divide r1 by r3 to yield the next term in our series in r4 */
        compute_quotient_into(ext4, 0, ext1, ext3);

        /* 
         *   if this value is too small to count in our accumulator, we're
         *   done 
         */
        if (is_zero(ext4)
            || get_exp(ext5) - get_exp(ext4) > (int)get_prec(ext4))
            break;

        /* 
         *   invert the sign of the term in r4 if this is a negative term 
         */
        if (neg_term)
            set_neg(ext4, !get_neg(ext4));

        /* add r4 to our running accumulator in r5, yielding r6 */
        compute_sum_into(ext6, ext5, ext4);

        /* swap r5 and r6 to put the accumulated value back into r5 */
        tmp = ext5;
        ext5 = ext6;
        ext6 = tmp;

        /* 
         *   move on to the next term: multiply r1 by x^2 into r2 to yield
         *   the next power of x that we require 
         */
        compute_prod_into(ext2, ext1, ext7);

        /* swap r1 and r2 to put our next required power back in r1 */
        tmp = ext1;
        ext1 = ext2;
        ext2 = tmp;

        /* 
         *   multiply r3 by (n+1)*(n+2) - it currently has n!, so this
         *   will yield (n+2)!  
         */
        mul_by_long(ext3, (n+1)*(n+2));

        /* advance n to the next term */
        n += 2;

        /* each term swaps signs */
        neg_term = !neg_term;
    }
    
    /* we're done - store the result, rounding if necessary */
    copy_val(new_ext, ext5, TRUE);
}